

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int p256(uint8_t *out_dh,uint8_t *my_private,uint8_t *their_public)

{
  int iVar1;
  EC_GROUP *group;
  size_t out_len;
  EC_FELEM y;
  EC_FELEM x;
  EC_SCALAR private_scalar;
  EC_AFFINE shared_point_affine;
  EC_AFFINE their_point_affine;
  EC_JACOBIAN shared_point;
  EC_JACOBIAN their_point;
  size_t local_3d0;
  EC_FELEM local_3c8;
  EC_FELEM local_380;
  EC_SCALAR local_338;
  EC_AFFINE local_2f0;
  EC_AFFINE local_260;
  EC_JACOBIAN local_1d0;
  EC_JACOBIAN local_f8;
  
  group = EC_group_p256();
  if ((((*their_public == '\x04') &&
       (iVar1 = ec_felem_from_bytes(group,&local_380,their_public + 1,0x20), iVar1 != 0)) &&
      (iVar1 = ec_felem_from_bytes(group,&local_3c8,their_public + 0x21,0x20), iVar1 != 0)) &&
     ((iVar1 = ec_point_set_affine_coordinates(group,&local_260,&local_380,&local_3c8), iVar1 != 0
      && (iVar1 = ec_scalar_from_bytes(group,&local_338,my_private,0x20), iVar1 != 0)))) {
    ec_affine_to_jacobian(group,&local_f8,&local_260);
    iVar1 = ec_point_mul_scalar(group,&local_1d0,&local_f8,&local_338);
    if ((iVar1 != 0) && (iVar1 = ec_jacobian_to_affine(group,&local_2f0,&local_1d0), iVar1 != 0)) {
      ec_felem_to_bytes(group,out_dh,&local_3d0,&local_2f0.X);
      if (local_3d0 == 0x20) {
        return 1;
      }
      __assert_fail("out_len == P256_SHARED_KEY_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                    ,0x1bb,"int p256(uint8_t *, const uint8_t *, const uint8_t *)");
    }
    iVar1 = 0x1b5;
  }
  else {
    iVar1 = 0x1ad;
  }
  ERR_put_error(6,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,iVar1);
  return 0;
}

Assistant:

static int p256(uint8_t out_dh[P256_SHARED_KEY_LEN],
                const uint8_t my_private[P256_PRIVATE_KEY_LEN],
                const uint8_t their_public[P256_PUBLIC_VALUE_LEN]) {
  const EC_GROUP *const group = EC_group_p256();
  EC_SCALAR private_scalar;
  EC_FELEM x, y;
  EC_JACOBIAN shared_point, their_point;
  EC_AFFINE their_point_affine, shared_point_affine;

  if (their_public[0] != POINT_CONVERSION_UNCOMPRESSED ||
      !ec_felem_from_bytes(group, &x, &their_public[1], 32) ||
      !ec_felem_from_bytes(group, &y, &their_public[33], 32) ||
      !ec_point_set_affine_coordinates(group, &their_point_affine, &x, &y) ||
      !ec_scalar_from_bytes(group, &private_scalar, my_private,
                            P256_PRIVATE_KEY_LEN)) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_INTERNAL_ERROR);
    return 0;
  }

  ec_affine_to_jacobian(group, &their_point, &their_point_affine);
  if (!ec_point_mul_scalar(group, &shared_point, &their_point,
                           &private_scalar) ||
      !ec_jacobian_to_affine(group, &shared_point_affine, &shared_point)) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_INTERNAL_ERROR);
    return 0;
  }

  size_t out_len;
  ec_felem_to_bytes(group, out_dh, &out_len, &shared_point_affine.X);
  assert(out_len == P256_SHARED_KEY_LEN);
  return 1;
}